

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  undefined1 auVar1 [8];
  size_t sVar2;
  bool bVar3;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  char **local_60;
  char *last_nonzero;
  allocator<char> local_41;
  undefined1 local_40 [8];
  char *ch;
  char buffer [32];
  double value_local;
  
  buffer._24_8_ = value;
  sprintf((char *)&ch,"%#.16g",value);
  sVar2 = strlen((char *)&ch);
  local_40 = (undefined1  [8])(local_40 + sVar2 + 7);
  if (*(char *)local_40 == '0') {
    while( true ) {
      auVar1 = local_40;
      bVar3 = false;
      if (&ch < (ulong)local_40) {
        bVar3 = *(char *)local_40 == '0';
      }
      if (!bVar3) break;
      local_40 = (undefined1  [8])((long)local_40 + -1);
    }
    local_60 = (char **)local_40;
    for (; &ch <= (ulong)local_40; local_40 = (undefined1  [8])((long)local_40 + -1)) {
      if (*(char *)local_40 == 0x2e) {
        *(char *)((long)auVar1 + 2) = '\0';
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,(char *)&ch,&local_61);
        std::allocator<char>::~allocator(&local_61);
        return __return_storage_ptr__;
      }
      if (9 < (int)*(char *)local_40 - 0x30U) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,(char *)&ch,&local_62);
        std::allocator<char>::~allocator(&local_62);
        return __return_storage_ptr__;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)&ch,&local_63);
    std::allocator<char>::~allocator(&local_63);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)&ch,&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString( double value )
{
   char buffer[32];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with visual studio 2005 to avoid warning. 
   sprintf_s(buffer, sizeof(buffer), "%#.16g", value); 
#else	
   sprintf(buffer, "%#.16g", value); 
#endif
   char* ch = buffer + strlen(buffer) - 1;
   if (*ch != '0') return buffer; // nothing to truncate, so save time
   while(ch > buffer && *ch == '0'){
     --ch;
   }
   char* last_nonzero = ch;
   while(ch >= buffer){
     switch(*ch){
     case '0':
     case '1':
     case '2':
     case '3':
     case '4':
     case '5':
     case '6':
     case '7':
     case '8':
     case '9':
       --ch;
       continue;
     case '.':
       // Truncate zeroes to save bytes in output, but keep one.
       *(last_nonzero+2) = '\0';
       return buffer;
     default:
       return buffer;
     }
   }
   return buffer;
}